

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int ParseExpBitAnd(char **p,aint *nval)

{
  int iVar1;
  bool bVar2;
  uint local_28;
  uint local_24;
  aint right;
  aint left;
  aint *nval_local;
  char **p_local;
  
  _right = (uint *)nval;
  nval_local = (aint *)p;
  iVar1 = ParseExpEqu(p,(aint *)&local_24);
  if (iVar1 != 0) {
    while( true ) {
      iVar1 = need((char **)nval_local,"&_");
      bVar2 = true;
      if (iVar1 == 0) {
        iVar1 = needa((char **)nval_local,"and",0x26,(char *)0x0,0,(char *)0x0,0,false);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        *_right = local_24;
        return 1;
      }
      iVar1 = ParseExpEqu((char **)nval_local,(aint *)&local_28);
      if (iVar1 == 0) break;
      local_24 = local_28 & local_24;
    }
  }
  return 0;
}

Assistant:

static int ParseExpBitAnd(char*& p, aint& nval) {
	aint left, right;
	if (!ParseExpEqu(p, left)) return 0;
	while (need(p, "&_") || needa(p, "and", '&')) {
		if (!ParseExpEqu(p, right)) return 0;
		left &= right;
	}
	nval = left;
	return 1;
}